

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_unnest.cpp
# Opt level: O0

void __thiscall duckdb::LogicalUnnest::ResolveTypes(LogicalUnnest *this)

{
  bool bVar1;
  iterator __last;
  iterator this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_01;
  value_type *in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  LogicalType *local_30;
  LogicalType *local_28;
  __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  in_stack_fffffffffffffff0;
  const_iterator __position;
  
  this_02 = &in_RDI[2].type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  __position._M_current = in_RDI;
  __last = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                     ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                      in_stack_ffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<duckdb::LogicalType_const*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>
  ::__normal_iterator<duckdb::LogicalType*>
            ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
              *)this_02,
             (__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
              *)in_stack_ffffffffffffff98);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)this_02,(size_type)in_stack_ffffffffffffff98);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)this_02);
  this_00 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                      ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                       in_stack_ffffffffffffff98);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)this_02,(size_type)in_stack_ffffffffffffff98);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)this_02);
  local_28 = (LogicalType *)
             ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                        in_stack_ffffffffffffff98);
  local_30 = (LogicalType *)
             ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
             insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>,void>
                       (this_00._M_current,__position,in_stack_fffffffffffffff0,__last._M_current);
  local_38 = &in_RDI[1].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_40._M_current =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)in_stack_ffffffffffffff98);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)this_02,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    this_01 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
              __gnu_cxx::
              __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffff98 =
         &in_RDI[2].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               this_02);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (this_01,in_RDI);
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void LogicalUnnest::ResolveTypes() {
	types.insert(types.end(), children[0]->types.begin(), children[0]->types.end());
	for (auto &expr : expressions) {
		types.push_back(expr->return_type);
	}
}